

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_i2rescale(fitsfile *infptr,int naxis,long *naxes,double rescale,fitsfile *outfptr,int *status
                )

{
  size_t __nmemb;
  fitsfile *fptr;
  int iVar1;
  short *array;
  size_t sVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  short nullvalue;
  int local_64;
  double local_60;
  fitsfile *local_58;
  fitsfile *local_50;
  int *local_48;
  long local_40;
  int tstatus;
  int anynul;
  
  __nmemb = *naxes;
  lVar4 = 1;
  if (1 < naxis) {
    lVar3 = 1;
    do {
      lVar4 = lVar4 * naxes[lVar3];
      lVar3 = lVar3 + 1;
    } while (naxis != lVar3);
  }
  local_60 = rescale;
  local_58 = infptr;
  local_50 = outfptr;
  array = (short *)calloc(__nmemb,2);
  fptr = local_58;
  if (array == (short *)0x0) {
    *status = 0x71;
    iVar1 = 0x71;
  }
  else {
    tstatus = 0;
    ffgky(local_58,0x15,"BLANK",&nullvalue,(char *)0x0,&tstatus);
    local_64 = tstatus;
    ffpscl(fptr,1.0,0.0,status);
    ffpscl(local_50,1.0,0.0,status);
    local_40 = lVar4;
    if (0 < lVar4) {
      lVar4 = 1;
      lVar3 = 0;
      local_48 = status;
      do {
        ffgpvi(local_58,1,lVar4,__nmemb,0,array,&anynul,status);
        status = local_48;
        if (local_64 == 0) {
          if (0 < (long)__nmemb) {
            sVar2 = 0;
            do {
              if (array[sVar2] != nullvalue) {
                dVar5 = (double)(int)array[sVar2] / local_60;
                array[sVar2] = (short)(int)(dVar5 + *(double *)
                                                     (&DAT_001c9070 + (ulong)(dVar5 < 0.0) * 8));
              }
              sVar2 = sVar2 + 1;
            } while (__nmemb != sVar2);
          }
        }
        else if (0 < (long)__nmemb) {
          sVar2 = 0;
          do {
            array[sVar2] = (short)(int)((double)(int)array[sVar2] / local_60 +
                                       *(double *)
                                        (&DAT_001c9070 +
                                        (ulong)((double)(int)array[sVar2] / local_60 < 0.0) * 8));
            sVar2 = sVar2 + 1;
          } while (__nmemb != sVar2);
        }
        ffppri(local_50,1,lVar4,__nmemb,array,local_48);
        lVar4 = lVar4 + __nmemb;
        lVar3 = lVar3 + 1;
      } while (lVar3 != local_40);
    }
    free(array);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int fp_i2rescale(fitsfile *infptr, int naxis, long *naxes, double rescale,
    fitsfile *outfptr, int *status)
{
/*
    divide the integer pixel values in the input file by rescale,
    and write back out to the output file..
*/

	long ii, jj, nelem = 1, nx, ny;
	short *intarray, nullvalue;
	int anynul, tstatus, checknull = 1;
	
	nx = naxes[0];
	ny = 1;
	
	for (ii = 1; ii < naxis; ii++) {
	    ny = ny * naxes[ii];
	}

	intarray = calloc(nx, sizeof(short));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TSHORT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   checknull = 0;
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr,  1.0, 0.0, status);
	fits_set_bscale(outfptr, 1.0, 0.0, status);

	for (ii = 0; ii < ny; ii++) {

	    fits_read_img_sht(infptr, 1, nelem, nx,
	        0, intarray, &anynul, status);

	    if (checknull) {
	        for (jj = 0; jj < nx; jj++) {
	            if (intarray[jj] != nullvalue)
		        intarray[jj] = NSHRT( (intarray[jj] / rescale) );
		}
	    } else {
	        for (jj = 0; jj < nx; jj++)
		        intarray[jj] = NSHRT( (intarray[jj] / rescale) );
	    }

	    fits_write_img_sht(outfptr, 1, nelem, nx, intarray, status);
	      
	    nelem += nx;
	}

	free(intarray);
	return(*status);
}